

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

DescriptorScriptPubKeyMan * __thiscall
wallet::CWallet::GetDescriptorScriptPubKeyMan(CWallet *this,WalletDescriptor *desc)

{
  long lVar1;
  bool bVar2;
  DescriptorScriptPubKeyMan *this_00;
  _Base_ptr p_Var3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  for (p_Var3 = (this->m_spk_managers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->m_spk_managers)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var3)) {
    if (*(long *)(p_Var3 + 2) != 0) {
      this_00 = (DescriptorScriptPubKeyMan *)
                __dynamic_cast(*(long *)(p_Var3 + 2),&ScriptPubKeyMan::typeinfo,
                               &DescriptorScriptPubKeyMan::typeinfo,0);
      if (this_00 != (DescriptorScriptPubKeyMan *)0x0) {
        bVar2 = DescriptorScriptPubKeyMan::HasWalletDescriptor(this_00,desc);
        if (bVar2) goto LAB_00153763;
      }
    }
  }
  this_00 = (DescriptorScriptPubKeyMan *)0x0;
LAB_00153763:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return this_00;
  }
  __stack_chk_fail();
}

Assistant:

DescriptorScriptPubKeyMan* CWallet::GetDescriptorScriptPubKeyMan(const WalletDescriptor& desc) const
{
    for (auto& spk_man_pair : m_spk_managers) {
        // Try to downcast to DescriptorScriptPubKeyMan then check if the descriptors match
        DescriptorScriptPubKeyMan* spk_manager = dynamic_cast<DescriptorScriptPubKeyMan*>(spk_man_pair.second.get());
        if (spk_manager != nullptr && spk_manager->HasWalletDescriptor(desc)) {
            return spk_manager;
        }
    }

    return nullptr;
}